

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_map.c
# Opt level: O1

void mapSet(VM *vm,ObjMap *objMap,Value key,Value value)

{
  char cVar1;
  uint uVar2;
  uint32_t newCapacity;
  Value value_00;
  Value key_00;
  
  key_00.field_1 = key.field_1;
  value_00.field_1 = value.field_1;
  key_00.type = key.type;
  if ((double)objMap->capacity * 0.8 < (double)(objMap->count + 1)) {
    uVar2 = objMap->capacity << 2;
    newCapacity = 0x40;
    if (0x40 < uVar2) {
      newCapacity = uVar2;
    }
    resizeMap(vm,objMap,newCapacity);
  }
  key_00._4_4_ = 0;
  value_00._0_8_ = value._0_8_ & 0xffffffff;
  cVar1 = addEntry(objMap->entries,objMap->capacity,key_00,value_00);
  if (cVar1 != '\0') {
    objMap->count = objMap->count + 1;
  }
  return;
}

Assistant:

void mapSet(VM *vm, ObjMap *objMap, Value key, Value value) {
    // 当容量达到阈值时扩容
    if (objMap->count + 1 > objMap->capacity * MAP_LOAD_PERCENT) {
        uint32_t newCapacity = objMap->capacity * CAPACITY_GROW_FACTOR;
        if (newCapacity < MIN_CAPACITY) {
            newCapacity = MIN_CAPACITY;
        }
        resizeMap(vm, objMap, newCapacity);
    }

    // 创建了新的key则count加1
    if (addEntry(objMap->entries, objMap->capacity, key, value)) {
        objMap->count++;
    }
}